

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::Temp::clear(Temp *this)

{
  pointer pdVar1;
  
  if (this->s_mark != (int *)0x0) {
    spx_free<int*>(&this->s_mark);
  }
  if (this->s_cact != (int *)0x0) {
    spx_free<int*>(&this->s_cact);
  }
  pdVar1 = (this->s_max).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (this->s_max).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->s_max).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  if (this->pivot_col != (Pring *)0x0) {
    spx_free<soplex::CLUFactor<double>::Pring*>(&this->pivot_col);
  }
  if (this->pivot_colNZ != (Pring *)0x0) {
    spx_free<soplex::CLUFactor<double>::Pring*>(&this->pivot_colNZ);
  }
  if (this->pivot_row != (Pring *)0x0) {
    spx_free<soplex::CLUFactor<double>::Pring*>(&this->pivot_row);
  }
  if (this->pivot_rowNZ != (Pring *)0x0) {
    spx_free<soplex::CLUFactor<double>::Pring*>(&this->pivot_rowNZ);
    return;
  }
  return;
}

Assistant:

void CLUFactor<R>::Temp::clear()
{
   if(s_mark != nullptr)
      spx_free(s_mark);

   if(s_cact != nullptr)
      spx_free(s_cact);

   if(!s_max.empty())
      s_max.clear();

   if(pivot_col != nullptr)
      spx_free(pivot_col);

   if(pivot_colNZ != nullptr)
      spx_free(pivot_colNZ);

   if(pivot_row != nullptr)
      spx_free(pivot_row);

   if(pivot_rowNZ != nullptr)
      spx_free(pivot_rowNZ);
}